

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O2

unique_ptr<Sock,_std::default_delete<Sock>_> CreateSockOS(int domain,int type,int protocol)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  int in_ECX;
  undefined4 in_register_0000003c;
  __uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true> _Var5;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  long *local_50;
  SOCKET hSocket;
  int on;
  long local_20;
  
  _Var5.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
  super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.super__Head_base<0UL,_Sock_*,_false>.
  _M_head_impl._4_4_ = in_register_0000003c;
  _Var5.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
  super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.super__Head_base<0UL,_Sock_*,_false>.
  _M_head_impl._0_4_ = domain;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (type != 0) {
    hSocket = socket(type,protocol,in_ECX);
    if (hSocket != 0xffffffff) {
      std::make_unique<Sock,unsigned_int&>((uint *)&local_50);
      if (((uint)type < 0xb) && ((0x406U >> (type & 0x1fU) & 1) != 0)) {
        cVar1 = (**(code **)(*local_50 + 0x68))();
        if (cVar1 == '\0') {
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
          ;
          source_file_00._M_len = 0x5b;
          logging_function_00._M_str = "CreateSockOS";
          logging_function_00._M_len = 0xc;
          LogPrintFormatInternal<>
                    (logging_function_00,source_file_00,0x20a,ALL,Info,
                     (ConstevalFormatString<0U>)0xe36b3f);
        }
        else {
          cVar1 = (**(code **)(*local_50 + 0x60))();
          if (cVar1 != '\0') {
            if ((type != 1) && (in_ECX == 6)) {
              on = 1;
              iVar3 = (**(code **)(*local_50 + 0x50))(local_50,6,1,&on,4);
              if (iVar3 == -1) {
                bVar2 = LogAcceptCategory(NET,Debug);
                if (bVar2) {
                  source_file._M_str =
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
                  ;
                  source_file._M_len = 0x5b;
                  logging_function._M_str = "CreateSockOS";
                  logging_function._M_len = 0xc;
                  LogPrintFormatInternal<>
                            (logging_function,source_file,0x226,NET,Debug,
                             (ConstevalFormatString<0U>)0xe36bb7);
                }
              }
            }
            goto LAB_00a87a25;
          }
          piVar4 = __errno_location();
          NetworkErrorString_abi_cxx11_((string *)&on,*piVar4);
          source_file_01._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/netbase.cpp"
          ;
          source_file_01._M_len = 0x5b;
          logging_function_01._M_str = "CreateSockOS";
          logging_function_01._M_len = 0xc;
          LogPrintFormatInternal<std::__cxx11::string>
                    (logging_function_01,source_file_01,0x21a,ALL,Info,
                     (ConstevalFormatString<1U>)0xe36b8d,(string *)&on);
          std::__cxx11::string::~string((string *)&on);
        }
        *(undefined8 *)
         _Var5.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
         super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
         super__Head_base<0UL,_Sock_*,_false>._M_head_impl = 0;
        if (local_50 != (long *)0x0) {
          (**(code **)(*local_50 + 8))();
        }
      }
      else {
LAB_00a87a25:
        *(long **)_Var5.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
                  super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
                  super__Head_base<0UL,_Sock_*,_false>._M_head_impl = local_50;
      }
      goto LAB_00a87a33;
    }
  }
  *(undefined8 *)
   _Var5.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
   super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.super__Head_base<0UL,_Sock_*,_false>.
   _M_head_impl = 0;
LAB_00a87a33:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
           (tuple<Sock_*,_std::default_delete<Sock>_>)
           _Var5.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
           super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
           super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Sock> CreateSockOS(int domain, int type, int protocol)
{
    // Not IPv4, IPv6 or UNIX
    if (domain == AF_UNSPEC) return nullptr;

    // Create a socket in the specified address family.
    SOCKET hSocket = socket(domain, type, protocol);
    if (hSocket == INVALID_SOCKET) {
        return nullptr;
    }

    auto sock = std::make_unique<Sock>(hSocket);

    if (domain != AF_INET && domain != AF_INET6 && domain != AF_UNIX) {
        return sock;
    }

    // Ensure that waiting for I/O on this socket won't result in undefined
    // behavior.
    if (!sock->IsSelectable()) {
        LogPrintf("Cannot create connection: non-selectable socket created (fd >= FD_SETSIZE ?)\n");
        return nullptr;
    }

#ifdef SO_NOSIGPIPE
    int set = 1;
    // Set the no-sigpipe option on the socket for BSD systems, other UNIXes
    // should use the MSG_NOSIGNAL flag for every send.
    if (sock->SetSockOpt(SOL_SOCKET, SO_NOSIGPIPE, (void*)&set, sizeof(int)) == SOCKET_ERROR) {
        LogPrintf("Error setting SO_NOSIGPIPE on socket: %s, continuing anyway\n",
                  NetworkErrorString(WSAGetLastError()));
    }
#endif

    // Set the non-blocking option on the socket.
    if (!sock->SetNonBlocking()) {
        LogPrintf("Error setting socket to non-blocking: %s\n", NetworkErrorString(WSAGetLastError()));
        return nullptr;
    }

#ifdef HAVE_SOCKADDR_UN
    if (domain == AF_UNIX) return sock;
#endif

    if (protocol == IPPROTO_TCP) {
        // Set the no-delay option (disable Nagle's algorithm) on the TCP socket.
        const int on{1};
        if (sock->SetSockOpt(IPPROTO_TCP, TCP_NODELAY, &on, sizeof(on)) == SOCKET_ERROR) {
            LogDebug(BCLog::NET, "Unable to set TCP_NODELAY on a newly created socket, continuing anyway\n");
        }
    }

    return sock;
}